

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O2

double Timer::now(bool measureWallclockTime)

{
  int iVar1;
  undefined7 in_register_00000039;
  timeval time;
  rusage local_98;
  
  if ((int)CONCAT71(in_register_00000039,measureWallclockTime) == 0) {
    getrusage(RUSAGE_SELF,&local_98);
    local_98.ru_utime.tv_sec = local_98.ru_stime.tv_sec + local_98.ru_utime.tv_sec;
    local_98.ru_utime.tv_usec = local_98.ru_stime.tv_usec + local_98.ru_utime.tv_usec;
  }
  else {
    iVar1 = gettimeofday(&local_98.ru_utime,(__timezone_ptr_t)0x0);
    if (iVar1 != 0) {
      return 0.0;
    }
  }
  return (double)local_98.ru_utime.tv_usec * 1e-06 + (double)local_98.ru_utime.tv_sec;
}

Assistant:

static double now(bool measureWallclockTime = true) {
#ifdef _WIN32
		if(measureWallclockTime){
			return static_cast<double>(std::clock()) / CLOCKS_PER_SEC;
		}
		else{
			LARGE_INTEGER tick, tps;
			QueryPerformanceFrequency(&tps);
			QueryPerformanceCounter(&tick);
			return( static_cast<double>( tick.QuadPart ) / static_cast<double>( tps.QuadPart ) );
		}
#else
		if(measureWallclockTime){
			timeval time;
			if (gettimeofday(&time,0)){
				//  Handle error
				return 0;
			}
			return time.tv_sec +1e-6 *time.tv_usec;
		}
		else
		{
			rusage res;
			getrusage(RUSAGE_SELF, &res);
			return(res.ru_utime.tv_sec + res.ru_stime.tv_sec)
				+ 1e-6 * (res.ru_utime.tv_usec + res.ru_stime.tv_usec);
		}
#endif
	}